

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O1

_Bool borg_good_buy(borg_item_conflict *item,wchar_t who,wchar_t ware)

{
  uint8_t uVar1;
  byte bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  ulong uVar5;
  char *what;
  uint8_t *puVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  
  if (item->tval - 0x1e < 5) {
    _Var3 = obj_kind_can_browse(k_info + item->kind);
    if (!_Var3) {
      return false;
    }
  }
  else if ((item->tval - 2 < 3) && (borg.trait[0x23] < 0x23)) {
    if (item->to_h != 0) {
      return false;
    }
    if (item->to_d != 0) {
      return false;
    }
  }
  if (who == L'\x06') {
    uVar1 = item->tval;
    if (uVar1 == '\x18') {
      bVar2 = item->sval;
      if (((sv_rod_healing == (uint)bVar2) ||
          (((sv_rod_recall == (uint)bVar2 && (borg.trait[0x19] != 5)) && (borg.trait[0x19] != 3))))
         || (((((wVar4 = (wchar_t)bVar2, sv_rod_speed == wVar4 && (borg.trait[0x19] != 7)) &&
               (borg.trait[0x19] != 2)) ||
              ((sv_rod_teleport_other == wVar4 && (borg.trait[0x19] == 6)))) ||
             ((sv_rod_illumination == wVar4 && (borg.trait[0xe4] == 0)))))) goto LAB_00242ab5;
    }
    else if (uVar1 == '\x1a') {
      bVar2 = item->sval;
      if ((((((sv_potion_star_healing == (uint)bVar2) || (sv_potion_life == (uint)bVar2)) ||
            (wVar4 = (wchar_t)bVar2, sv_potion_healing == wVar4)) ||
           ((sv_potion_inc_str == wVar4 && (borg.trait[10] < 0x76)))) ||
          ((sv_potion_inc_int == wVar4 && (borg.trait[0xb] < 0x76)))) ||
         ((((sv_potion_inc_wis == wVar4 && (borg.trait[0xc] < 0x76)) ||
           ((sv_potion_inc_dex == (uint)bVar2 && (borg.trait[0xd] < 0x76)))) ||
          ((sv_potion_inc_con == (uint)bVar2 && (borg.trait[0xe] < 0x76)))))) goto LAB_00242ab5;
    }
    else if ((uVar1 == '\x19') &&
            ((sv_scroll_remove_curse == (uint)item->sval && (borg.trait[0x9f] != 0)))) {
      return true;
    }
    _Var3 = obj_kind_can_browse(k_info + item->kind);
    if ((((_Var3) && (wVar4 = borg_get_book_num((uint)item->sval), borg.amt_book[wVar4] == 0)) &&
        (_Var3 = borg_is_dungeon_book((uint)item->tval,(uint)item->sval), _Var3)) ||
       ((item->tval == '\x19' &&
        ((sv_scroll_teleport_level == (uint)item->sval || (sv_scroll_teleport == (uint)item->sval)))
        ))) {
LAB_00242ab5:
      if (borg_cfg[0x19] == 0) {
        return true;
      }
      if (borg.trait[0x23] < 10) {
        return true;
      }
      if (borg.trait[0x1a] == 0) {
        return true;
      }
      if (99 < (int)num_food + borg.trait[0x27]) {
        if (85000 < item->cost) {
          return true;
        }
        if (0x5a < borg.trait[0x23] + adj_dex_safe[borg.trait[0x12]]) {
          borg_cfg[0x18] = item->cost;
          borg_money_scum_who = 1;
          borg_money_scum_ware = ware;
          return true;
        }
        return true;
      }
      return true;
    }
    if ((borg.trait[0x23] < 0xf) && (borg.trait[0x2d] < 20000)) {
      return false;
    }
    if ((borg.trait[0x23] < 0x23) && (borg.trait[0x2d] < 15000)) {
      return false;
    }
    if (borg.trait[0x2d] < 10000) {
      return false;
    }
  }
  uVar5 = (ulong)sold_item_num;
  bVar8 = 0 < (long)uVar5;
  if (0 < (long)uVar5) {
    uVar7 = 1;
    do {
      if (((*(uint *)(uVar7 * 4 + 0x30678c) == (uint)item->tval) &&
          (*(uint *)(uVar7 * 4 + 0x3067bc) == (uint)item->sval)) &&
         (*(wchar_t *)(uVar7 * 4 + 0x3067ec) == who)) {
        if (*borg_cfg != 0) {
          what = format("# Choosing not to buy back %s",item);
          borg_note(what);
        }
        if (bVar8) {
          return false;
        }
        break;
      }
      bVar8 = uVar7 < uVar5;
      bVar9 = uVar7 != uVar5;
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  if (item->tval == '\x06') {
    uVar5 = (ulong)z_info->pack_size;
    bVar8 = uVar5 != 0;
    if (bVar8) {
      if (borg_items->tval != '\x06') {
        puVar6 = &borg_items[1].tval;
        uVar7 = 0;
        do {
          if (uVar5 - 1 == uVar7) goto LAB_00242a36;
          uVar7 = uVar7 + 1;
          uVar1 = *puVar6;
          puVar6 = puVar6 + 0x388;
        } while (uVar1 != '\x06');
        bVar8 = uVar7 < uVar5;
      }
      if (bVar8) {
        return false;
      }
    }
  }
LAB_00242a36:
  if ((((4 < borg.trait[0x24]) || (_Var3 = obj_kind_can_browse(k_info + item->kind), !_Var3)) ||
      (item->sval == '\0')) &&
     (((_Var3 = borg_primarily_caster(), _Var3 || (8 < borg.trait[0x24])) ||
      ((_Var3 = obj_kind_can_browse(k_info + item->kind), !_Var3 || (item->sval == '\0')))))) {
    return true;
  }
  return false;
}

Assistant:

static bool borg_good_buy(borg_item *item, int who, int ware)
{
    /* Check the object */
    switch (item->tval) {
    case TV_SHOT:
    case TV_ARROW:
    case TV_BOLT:
        if (borg.trait[BI_CLEVEL] < 35) {
            if (item->to_h)
                return false;
            if (item->to_d)
                return false;
        }
        break;

    case TV_PRAYER_BOOK:
    case TV_MAGIC_BOOK:
    case TV_NATURE_BOOK:
    case TV_SHADOW_BOOK:
    case TV_OTHER_BOOK: 
        /* not our book */
        if (!obj_kind_can_browse(&k_info[item->kind]))
            return false;
        break;
    }

    /* Don't buy from the BM until we are rich */
    if (who == 6) {
        /* buying Remove Curse scroll is acceptable */
        if (item->tval == TV_SCROLL && item->sval == sv_scroll_remove_curse
            && borg.trait[BI_FIRST_CURSED])
            return true;

        /* Buying certain special items are acceptable */
        if ((item->tval == TV_POTION
                && ((item->sval == sv_potion_star_healing)
                    || (item->sval == sv_potion_life)
                    || (item->sval == sv_potion_healing)
                    || (item->sval == sv_potion_inc_str
                        && borg.trait[BI_CSTR] < (18 + 100))
                    || (item->sval == sv_potion_inc_int
                        && borg.trait[BI_CINT] < (18 + 100))
                    || (item->sval == sv_potion_inc_wis
                        && borg.trait[BI_CWIS] < (18 + 100))
                    || (item->sval == sv_potion_inc_dex
                        && borg.trait[BI_CDEX] < (18 + 100))
                    || (item->sval == sv_potion_inc_con
                        && borg.trait[BI_CCON] < (18 + 100))))
            || (item->tval == TV_ROD
                && ((item->sval == sv_rod_healing) ||
                    /* priests and paladins can cast recall */
                    (item->sval == sv_rod_recall
                        && borg.trait[BI_CLASS] != CLASS_PRIEST
                        && borg.trait[BI_CLASS] != CLASS_PALADIN)
                    ||
                    /* druid and ranger can cast haste*/
                    (item->sval == sv_rod_speed
                        && borg.trait[BI_CLASS] != CLASS_DRUID
                        && borg.trait[BI_CLASS] != CLASS_RANGER)
                    ||
                    /* mage and rogue can cast teleport away */
                    (item->sval == sv_rod_teleport_other
                        && borg.trait[BI_CLASS] != CLASS_MAGE
                        && borg.trait[BI_CLASS] == CLASS_ROGUE)
                    || (item->sval == sv_rod_illumination
                        && (!borg.trait[BI_ALITE]))))
            || (obj_kind_can_browse(&k_info[item->kind])
                && borg.amt_book[borg_get_book_num(item->sval)] == 0
                && borg_is_dungeon_book(item->tval, item->sval))
            || (item->tval == TV_SCROLL
                && (item->sval == sv_scroll_teleport_level
                    || item->sval == sv_scroll_teleport))) {
            /* Hack-- Allow the borg to scum for this Item */
            if (borg_cfg[BORG_SELF_SCUM] && /* borg is allowed to scum */
                borg.trait[BI_CLEVEL] >= 10 && /* Be of sufficient level */
                borg.trait[BI_LIGHT] && /* Have some Perma lite source */
                borg.trait[BI_FOOD] + num_food >= 100
                && /* Have plenty of food */
                item->cost <= 85000) /* Its not too expensive */
            {
                if (adj_dex_safe[borg.trait[BI_DEX_INDEX]] + borg.trait[BI_CLEVEL]
                    > 90) /* Good chance to thwart mugging */
                {
                    /* Record the amount that I need to make purchase */
                    borg_cfg[BORG_MONEY_SCUM_AMOUNT] = item->cost;
                    borg_money_scum_who              = who;
                    borg_money_scum_ware             = ware;
                }
            }

            /* Ok to buy this */
            return true;
        }

        if ((borg.trait[BI_CLEVEL] < 15) && (borg.trait[BI_GOLD] < 20000))
            return false;
        if ((borg.trait[BI_CLEVEL] < 35) && (borg.trait[BI_GOLD] < 15000))
            return false;
        if (borg.trait[BI_GOLD] < 10000)
            return false;
    }

    /* do not buy the item if I just sold it. */
    for (int p = 0; p < sold_item_num; p++) {

        if (sold_item_tval[p] == item->tval && sold_item_sval[p] == item->sval
            && sold_item_store[p] == who) {
            if (borg_cfg[BORG_VERBOSE])
                borg_note(format("# Choosing not to buy back %s", item->desc));
            return false;
        }
    }

    /* Do not buy a second digger */
    if (item->tval == TV_DIGGING) {
        int ii;

        /* scan for an existing digger */
        for (ii = 0; ii < z_info->pack_size; ii++) {
            borg_item *item2 = &borg_items[ii];

            /* skip non diggers */
            if (item2->tval == TV_DIGGING)
                return false;
#if 0
            /* perhaps let him buy a digger with a better
             * pval than his current digger
             */
            { if (item->pval <= item2->pval) return false; }
#endif
        }
    }

    /* Low level borgs should not waste the money on certain things */
    if (borg.trait[BI_MAXCLEVEL] < 5) {
        /* next book, cant read it */
        if (obj_kind_can_browse(&k_info[item->kind]) && item->sval >= 1)
            return false;
    }

    /* Not direct spell casters and the extra books */
    /* classes that are direct spell casters get more than 3 books */
    if (!borg_primarily_caster() && borg.trait[BI_MAXCLEVEL] <= 8) {
        if (obj_kind_can_browse(&k_info[item->kind]) && item->sval >= 1)
            return false;
    }

    /* Okay */
    return true;
}